

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::interval_t,duckdb::dtime_tz_t,duckdb::dtime_tz_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddTimeOperator,bool>
               (interval_t *ldata,dtime_tz_t *rdata,dtime_tz_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  ulong uVar6;
  dtime_tz_t dVar7;
  ulong uVar8;
  idx_t i_1;
  idx_t row_idx;
  idx_t row_idx_00;
  idx_t i;
  ulong uVar9;
  idx_t row_idx_01;
  interval_t right;
  interval_t right_00;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    for (uVar9 = 0; count != uVar9; uVar9 = uVar9 + 1) {
      uVar6 = uVar9;
      if (lsel->sel_vector != (sel_t *)0x0) {
        uVar6 = (ulong)lsel->sel_vector[uVar9];
      }
      uVar8 = uVar9;
      if (rsel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)rsel->sel_vector[uVar9];
      }
      uVar1 = ldata[uVar6].months;
      uVar3 = ldata[uVar6].days;
      right.days = uVar3;
      right.months = uVar1;
      right.micros = ldata[uVar6].micros;
      dVar7 = AddTimeOperator::Operation<duckdb::dtime_tz_t,duckdb::interval_t,duckdb::dtime_tz_t>
                        (rdata[uVar8].bits,right);
      result_data[uVar9].bits = dVar7.bits;
    }
  }
  else {
    for (row_idx = 0; count != row_idx; row_idx = row_idx + 1) {
      row_idx_00 = row_idx;
      if (lsel->sel_vector != (sel_t *)0x0) {
        row_idx_00 = (idx_t)lsel->sel_vector[row_idx];
      }
      row_idx_01 = row_idx;
      if (rsel->sel_vector != (sel_t *)0x0) {
        row_idx_01 = (idx_t)rsel->sel_vector[row_idx];
      }
      bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&lvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
      if (bVar5) {
        bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&rvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_01);
        if (!bVar5) goto LAB_014d4b4e;
        uVar2 = ldata[row_idx_00].months;
        uVar4 = ldata[row_idx_00].days;
        right_00.days = uVar4;
        right_00.months = uVar2;
        right_00.micros = ldata[row_idx_00].micros;
        dVar7 = AddTimeOperator::Operation<duckdb::dtime_tz_t,duckdb::interval_t,duckdb::dtime_tz_t>
                          (rdata[row_idx_01].bits,right_00);
        result_data[row_idx].bits = dVar7.bits;
      }
      else {
LAB_014d4b4e:
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_validity->super_TemplatedValidityMask<unsigned_long>,row_idx);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}